

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolicyPureVector.cpp
# Opt level: O2

void __thiscall PolicyPureVector::SetDepth(PolicyPureVector *this,size_t d)

{
  int iVar1;
  Interface_ProblemToPolicyDiscretePure *pIVar2;
  undefined4 extraout_var;
  
  (this->super_PolicyDiscretePure).super_PolicyDiscrete.super_Policy._m_depth = d;
  pIVar2 = PolicyDiscretePure::GetInterfacePTPDiscretePure(&this->super_PolicyDiscretePure);
  iVar1 = (*(pIVar2->super_Interface_ProblemToPolicyDiscrete).
            _vptr_Interface_ProblemToPolicyDiscrete[5])
                    (pIVar2,(ulong)*(uint *)&(this->super_PolicyDiscretePure).super_PolicyDiscrete.
                                             field_0x34,
                     (ulong)(this->super_PolicyDiscretePure).super_PolicyDiscrete._m_indexDomCat,d);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&this->_m_domainToActionIndices,CONCAT44(extraout_var,iVar1));
  return;
}

Assistant:

void PolicyPureVector::SetDepth(size_t d)
{
    Policy::SetDepth(d);
    _m_domainToActionIndices.resize(
        GetInterfacePTPDiscretePure()->GetNrPolicyDomainElements(
            _m_agentI,
            GetPolicyDomainCategory(),
            d));
}